

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O3

bool __thiscall
absl::lts_20250127::synchronization_internal::GraphCycles::InsertEdge
          (GraphCycles *this,GraphId idx,GraphId idy)

{
  int iVar1;
  int iVar2;
  Rep *this_00;
  Node **ppNVar3;
  Node *pNVar4;
  int *piVar5;
  Node *pNVar6;
  NodeSet *pNVar7;
  int *piVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  bool bVar11;
  uint uVar12;
  uint uVar13;
  uint32_t uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  bool bVar18;
  ulong uVar19;
  Node *pNVar20;
  Node *pNVar21;
  uint local_64;
  int local_60;
  int local_5c;
  Vec<int> *local_58;
  uint64_t local_50;
  uint64_t local_48;
  int *local_40;
  Vec<int> *local_38;
  
  this_00 = this->rep_;
  ppNVar3 = (this_00->nodes_).ptr_;
  pNVar20 = ppNVar3[idx.handle & 0xffffffff];
  if (pNVar20->version != (uint32_t)(idx.handle >> 0x20)) {
    pNVar20 = (Node *)0x0;
  }
  uVar12 = (uint)idy.handle;
  pNVar4 = ppNVar3[idy.handle & 0xffffffff];
  pNVar21 = (Node *)0x0;
  if (pNVar4->version == (uint32_t)(idy.handle >> 0x20)) {
    pNVar21 = pNVar4;
  }
  bVar18 = true;
  if ((pNVar20 != (Node *)0x0) && (pNVar21 != (Node *)0x0)) {
    if (pNVar20 == pNVar21) {
LAB_003842a8:
      bVar18 = false;
    }
    else {
      local_50 = idx.handle;
      bVar11 = anon_unknown_0::NodeSet::insert(&pNVar20->out,uVar12);
      if (bVar11) {
        anon_unknown_0::NodeSet::insert(&pNVar21->in,(int32_t)local_50);
        local_60 = pNVar20->rank;
        if (pNVar21->rank < local_60) {
          piVar5 = (this_00->deltaf_).ptr_;
          piVar8 = (this_00->deltaf_).space_;
          local_64 = uVar12;
          local_48 = idy.handle;
          if (piVar5 != piVar8) {
            base_internal::LowLevelAlloc::Free(piVar5);
          }
          (this_00->deltaf_).ptr_ = piVar8;
          (this_00->deltaf_).size_ = 0;
          (this_00->deltaf_).capacity_ = 8;
          local_58 = &this_00->stack_;
          piVar5 = (this_00->stack_).ptr_;
          piVar8 = (this_00->stack_).space_;
          if (piVar5 != piVar8) {
            base_internal::LowLevelAlloc::Free(piVar5);
          }
          (this_00->stack_).ptr_ = piVar8;
          (this_00->stack_).size_ = 0;
          (this_00->stack_).capacity_ = 8;
          local_40 = piVar8;
          anon_unknown_0::Vec<int>::push_back(local_58,(int *)&local_64);
          uVar12 = (this_00->stack_).size_;
          uVar19 = (ulong)uVar12;
          if (uVar12 != 0) {
            local_38 = &this_00->deltaf_;
            do {
              uVar12 = (int)uVar19 - 1;
              uVar19 = (ulong)uVar12;
              local_64 = (this_00->stack_).ptr_[uVar19];
              (this_00->stack_).size_ = uVar12;
              pNVar4 = (this_00->nodes_).ptr_[local_64];
              if (pNVar4->visited == false) {
                pNVar4->visited = true;
                anon_unknown_0::Vec<int>::push_back(local_38,(int *)&local_64);
                uVar19 = 0;
                while( true ) {
                  uVar10 = local_48;
                  uVar12 = (pNVar4->out).table_.size_;
                  uVar16 = (ulong)uVar12;
                  if (uVar12 < (uint)uVar19) {
                    uVar16 = uVar19 & 0xffffffff;
                  }
                  uVar19 = uVar19 & 0xffffffff;
                  lVar17 = 0;
                  do {
                    if ((uVar19 - uVar16) + lVar17 == 0) {
                      uVar19 = (ulong)(this_00->stack_).size_;
                      goto LAB_00383fb9;
                    }
                    iVar1 = (pNVar4->out).table_.ptr_[uVar19 + lVar17];
                    lVar17 = lVar17 + 1;
                  } while ((long)iVar1 < 0);
                  uVar19 = uVar19 + lVar17;
                  ppNVar3 = (this_00->nodes_).ptr_;
                  pNVar6 = ppNVar3[iVar1];
                  iVar2 = pNVar6->rank;
                  local_5c = iVar1;
                  if (iVar2 == local_60) break;
                  if ((iVar2 < local_60) && (pNVar6->visited == false)) {
                    anon_unknown_0::Vec<int>::push_back(local_58,&local_5c);
                  }
                }
                pNVar7 = (NodeSet *)(pNVar20->out).table_.ptr_;
                uVar14 = anon_unknown_0::NodeSet::FindIndex(pNVar7,(pNVar20->out).table_.size_);
                uVar9 = local_50;
                if ((pNVar7->table_).space_[(ulong)uVar14 - 2] == (int)uVar10) {
                  (pNVar7->table_).space_[(ulong)uVar14 - 2] = -2;
                }
                pNVar7 = (NodeSet *)(pNVar21->in).table_.ptr_;
                uVar14 = anon_unknown_0::NodeSet::FindIndex(pNVar7,(pNVar21->in).table_.size_);
                if ((pNVar7->table_).space_[(ulong)uVar14 - 2] == (int)uVar9) {
                  (pNVar7->table_).space_[(ulong)uVar14 - 2] = -2;
                }
                uVar19 = (ulong)(this_00->deltaf_).size_;
                if (uVar19 != 0) {
                  piVar8 = (this_00->deltaf_).ptr_;
                  lVar17 = 0;
                  do {
                    ppNVar3[*(uint *)((long)piVar8 + lVar17)]->visited = false;
                    lVar17 = lVar17 + 4;
                  } while (uVar19 << 2 != lVar17);
                  return false;
                }
                goto LAB_003842a8;
              }
LAB_00383fb9:
            } while ((int)uVar19 != 0);
          }
          local_60 = pNVar21->rank;
          local_64 = (uint)local_50;
          piVar5 = (this_00->deltab_).ptr_;
          piVar8 = (this_00->deltab_).space_;
          if (piVar5 != piVar8) {
            base_internal::LowLevelAlloc::Free(piVar5);
          }
          piVar5 = local_40;
          (this_00->deltab_).ptr_ = piVar8;
          (this_00->deltab_).size_ = 0;
          (this_00->deltab_).capacity_ = 8;
          piVar8 = (this_00->stack_).ptr_;
          if (piVar8 != local_40) {
            base_internal::LowLevelAlloc::Free(piVar8);
          }
          (this_00->stack_).ptr_ = piVar5;
          (this_00->stack_).size_ = 0;
          (this_00->stack_).capacity_ = 8;
          anon_unknown_0::Vec<int>::push_back(local_58,(int *)&local_64);
          uVar12 = (this_00->stack_).size_;
          uVar19 = (ulong)uVar12;
          if (uVar12 != 0) {
            do {
              uVar12 = (int)uVar19 - 1;
              uVar19 = (ulong)uVar12;
              local_64 = (this_00->stack_).ptr_[uVar19];
              (this_00->stack_).size_ = uVar12;
              pNVar20 = (this_00->nodes_).ptr_[local_64];
              if (pNVar20->visited == false) {
                pNVar20->visited = true;
                anon_unknown_0::Vec<int>::push_back(&this_00->deltab_,(int *)&local_64);
                uVar19 = 0;
                do {
                  uVar12 = (pNVar20->in).table_.size_;
                  uVar16 = (ulong)uVar12;
                  if (uVar12 < (uint)uVar19) {
                    uVar16 = uVar19 & 0xffffffff;
                  }
                  uVar19 = uVar19 & 0xffffffff;
                  lVar17 = 0;
                  do {
                    if ((uVar19 - uVar16) + lVar17 == 0) {
                      uVar19 = (ulong)(this_00->stack_).size_;
                      goto LAB_003840ec;
                    }
                    iVar1 = (pNVar20->in).table_.ptr_[uVar19 + lVar17];
                    lVar17 = lVar17 + 1;
                  } while ((long)iVar1 < 0);
                  pNVar4 = (this_00->nodes_).ptr_[iVar1];
                  local_5c = iVar1;
                  if ((pNVar4->visited == false) && (local_60 < pNVar4->rank)) {
                    anon_unknown_0::Vec<int>::push_back(local_58,&local_5c);
                  }
                  uVar19 = uVar19 + lVar17;
                } while( true );
              }
LAB_003840ec:
            } while ((int)uVar19 != 0);
          }
          Sort((synchronization_internal *)this_00,
               (Vec<absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Node_*> *)
               (this_00->deltab_).ptr_,(Vec<int> *)(ulong)(this_00->deltab_).size_);
          Sort((synchronization_internal *)this_00,
               (Vec<absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Node_*> *)
               (this_00->deltaf_).ptr_,(Vec<int> *)(ulong)(this_00->deltaf_).size_);
          piVar5 = (this_00->list_).ptr_;
          piVar8 = (this_00->list_).space_;
          if (piVar5 != piVar8) {
            base_internal::LowLevelAlloc::Free(piVar5);
          }
          (this_00->list_).ptr_ = piVar8;
          (this_00->list_).size_ = 0;
          (this_00->list_).capacity_ = 8;
          MoveToList((synchronization_internal *)this_00,(Rep *)(this_00->deltab_).ptr_,
                     (Vec<int> *)(ulong)(this_00->deltab_).size_,&this_00->list_);
          MoveToList((synchronization_internal *)this_00,(Rep *)(this_00->deltaf_).ptr_,
                     (Vec<int> *)(ulong)(this_00->deltaf_).size_,&this_00->list_);
          uVar13 = (this_00->deltaf_).size_;
          uVar15 = (this_00->deltab_).size_;
          uVar12 = uVar13 + uVar15;
          bVar18 = true;
          if ((this_00->merged_).capacity_ < uVar12) {
            anon_unknown_0::Vec<int>::Grow(&this_00->merged_,uVar12);
            uVar13 = (this_00->deltaf_).size_;
            uVar15 = (this_00->deltab_).size_;
          }
          (this_00->merged_).size_ = uVar12;
          piVar8 = (this_00->deltaf_).ptr_;
          piVar5 = (this_00->deltab_).ptr_;
          std::__merge<int*,int*,int*,__gnu_cxx::__ops::_Iter_less_iter>
                    (piVar5,piVar5 + uVar15,piVar8,piVar8 + uVar13,(this_00->merged_).ptr_);
          uVar19 = (ulong)(this_00->list_).size_;
          if (uVar19 != 0) {
            piVar8 = (this_00->merged_).ptr_;
            piVar5 = (this_00->list_).ptr_;
            ppNVar3 = (this_00->nodes_).ptr_;
            uVar16 = 0;
            do {
              ppNVar3[(uint)piVar5[uVar16]]->rank = piVar8[uVar16];
              uVar16 = uVar16 + 1;
            } while (uVar19 != uVar16);
          }
        }
      }
    }
  }
  return bVar18;
}

Assistant:

bool GraphCycles::InsertEdge(GraphId idx, GraphId idy) {
  Rep* r = rep_;
  const int32_t x = NodeIndex(idx);
  const int32_t y = NodeIndex(idy);
  Node* nx = FindNode(r, idx);
  Node* ny = FindNode(r, idy);
  if (nx == nullptr || ny == nullptr) return true;  // Expired ids

  if (nx == ny) return false;  // Self edge
  if (!nx->out.insert(y)) {
    // Edge already exists.
    return true;
  }

  ny->in.insert(x);

  if (nx->rank <= ny->rank) {
    // New edge is consistent with existing rank assignment.
    return true;
  }

  // Current rank assignments are incompatible with the new edge.  Recompute.
  // We only need to consider nodes that fall in the range [ny->rank,nx->rank].
  if (!ForwardDFS(r, y, nx->rank)) {
    // Found a cycle.  Undo the insertion and tell caller.
    nx->out.erase(y);
    ny->in.erase(x);
    // Since we do not call Reorder() on this path, clear any visited
    // markers left by ForwardDFS.
    for (const auto& d : r->deltaf_) {
      r->nodes_[static_cast<uint32_t>(d)]->visited = false;
    }
    return false;
  }
  BackwardDFS(r, x, ny->rank);
  Reorder(r);
  return true;
}